

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O1

void __thiscall
wasm::Memory64Lowering::visitDataSegment(Memory64Lowering *this,DataSegment *segment)

{
  Expression *pEVar1;
  Module *this_00;
  pointer ppFVar2;
  pointer ppGVar3;
  bool bVar4;
  Module *pMVar5;
  Global *pGVar6;
  Module *pMVar7;
  Const *pCVar8;
  ImportInfo *curr;
  ImportInfo *pIVar9;
  undefined1 local_c8 [8];
  ImportInfo info;
  Builder builder;
  
  if (segment->isPassive == false) {
    pEVar1 = segment->offset;
    if (pEVar1->_id == GlobalGetId) {
      this_00 = (this->
                super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
                .super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>.
                currModule;
      pGVar6 = Module::getGlobal(this_00,(Name)pEVar1[1]);
      if (((pGVar6->super_Importable).module.super_IString.str._M_str != (char *)0x0) &&
         ((pGVar6->super_Importable).base.super_IString.str._M_str == _ZN4wasmL11MEMORY_BASEE_1)) {
        ImportInfo::ImportInfo((ImportInfo *)local_c8,this_00);
        ppFVar2 = _DAT_00dbcf10;
        pMVar5 = MEMORY_BASE32;
        if (info.wasm !=
            (Module *)
            info.importedGlobals.super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pMVar7 = info.wasm;
          pIVar9 = (ImportInfo *)local_c8;
          do {
            curr = (ImportInfo *)
                   (pMVar7->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
            if (((curr->importedFunctions).
                 super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 (pointer)(pGVar6->super_Importable).module.super_IString.str._M_str) &&
               ((curr->importedFunctions).
                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == _DAT_00dbcf10)) {
              bVar4 = false;
            }
            else {
              bVar4 = true;
              curr = pIVar9;
            }
            if (!bVar4) goto LAB_0079d7b8;
            pMVar7 = (Module *)
                     &(pMVar7->exports).
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pIVar9 = curr;
          } while (pMVar7 != (Module *)
                             info.importedGlobals.
                             super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                             _M_impl.super__Vector_impl_data._M_start);
        }
        curr = (ImportInfo *)0x0;
LAB_0079d7b8:
        if (curr == (ImportInfo *)0x0) {
          info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
          pCVar8 = Builder::makeConst<int>
                             ((Builder *)
                              &info.importedTags.
                               super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage,0);
          curr = (ImportInfo *)operator_new(0x50);
          curr->wasm = (Module *)0x0;
          (curr->importedGlobals).
          super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (curr->importedFunctions).
          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (curr->importedTables).super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (curr->importedTables).super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (curr->importedTables).super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (curr->importedFunctions).
          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (curr->importedFunctions).
          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (curr->importedGlobals).
          super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (curr->importedGlobals).
          super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          curr->wasm = pMVar5;
          (curr->importedGlobals).
          super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)ppFVar2;
          (curr->importedTables).super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
          (curr->importedTables).super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)pCVar8;
          *(undefined1 *)
           &(curr->importedTables).super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
          ppFVar2 = (pointer)(pGVar6->super_Importable).module.super_IString.str._M_str;
          (curr->importedGlobals).
          super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(pGVar6->super_Importable).module.super_IString.str._M_len;
          (curr->importedFunctions).
          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
          super__Vector_impl_data._M_start = ppFVar2;
          ppFVar2 = _DAT_00dbcf10;
          (curr->importedFunctions).
          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)MEMORY_BASE32;
          (curr->importedFunctions).
          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = ppFVar2;
          Module::addGlobal(this_00,(Global *)curr);
        }
        (pEVar1->type).id = 2;
        ppGVar3 = (curr->importedGlobals).
                  super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        *(Module **)(pEVar1 + 1) = curr->wasm;
        pEVar1[1].type.id = (uintptr_t)ppGVar3;
        if (info.importedMemories.
            super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(info.importedMemories.
                          super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)info.importedTags.
                                super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)info.importedMemories.
                                super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (info.importedTables.super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(info.importedTables.
                          super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                          (long)info.importedMemories.
                                super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)info.importedTables.
                                super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (info.importedFunctions.
            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(info.importedFunctions.
                          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)info.importedTables.
                                super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)info.importedFunctions.
                                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (info.importedGlobals.super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(info.importedGlobals.
                          super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)info.importedFunctions.
                                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)info.importedGlobals.
                                super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (info.wasm != (Module *)0x0) {
          operator_delete(info.wasm,
                          (long)info.importedGlobals.
                                super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)info.wasm);
        }
      }
    }
    else if (pEVar1->_id == ConstId) {
      if (*(long *)(pEVar1 + 2) != 3) {
        __assert_fail("type == Type::i64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                      ,0x121,"int64_t wasm::Literal::geti64() const");
      }
      local_c8._0_4_ = pEVar1[1]._id;
      info.importedGlobals.super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
      Literal::operator=((Literal *)(pEVar1 + 1),(Literal *)local_c8);
      Literal::~Literal((Literal *)local_c8);
      (pEVar1->type).id = 2;
    }
  }
  return;
}

Assistant:

void visitDataSegment(DataSegment* segment) {
    if (!segment->isPassive) {
      if (auto* c = segment->offset->dynCast<Const>()) {
        c->value = Literal(static_cast<uint32_t>(c->value.geti64()));
        c->type = Type::i32;
      } else if (auto* get = segment->offset->dynCast<GlobalGet>()) {
        auto& module = *getModule();
        auto* g = module.getGlobal(get->name);
        if (g->imported() && g->base == MEMORY_BASE) {
          ImportInfo info(module);
          auto* memoryBase32 = info.getImportedGlobal(g->module, MEMORY_BASE32);
          if (!memoryBase32) {
            Builder builder(module);
            memoryBase32 = builder
                             .makeGlobal(MEMORY_BASE32,
                                         Type::i32,
                                         builder.makeConst(int32_t(0)),
                                         Builder::Immutable)
                             .release();
            memoryBase32->module = g->module;
            memoryBase32->base = MEMORY_BASE32;
            module.addGlobal(memoryBase32);
          }
          // Use this alternative import when initializing the segment.
          assert(memoryBase32);
          get->type = Type::i32;
          get->name = memoryBase32->name;
        }
      }
    }
  }